

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void tcg_dump_op_sparc64(TCGContext_conflict8 *s,_Bool have_prefs,TCGOp *op)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined8 uVar4;
  FILE *pFVar5;
  uint uVar6;
  uint uVar7;
  gpointer pvVar8;
  TCGArg in_RCX;
  TCGArg TVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  char *__format;
  char *pcVar14;
  int iVar15;
  undefined8 *puVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  size_t sStack_f0;
  ulong local_d0;
  char buf [128];
  
  pFVar5 = _stderr;
  uVar10 = *(uint *)op;
  uVar6 = uVar10 & 0xff;
  puVar16 = (undefined8 *)((long)&s->tcg_op_defs->name + (ulong)(uVar6 << 5));
  if ((byte)uVar10 == 2) {
    uVar6 = uVar10 >> 0xc & 0xf;
    local_d0 = (ulong)uVar6;
    uVar10 = uVar10 >> 8 & 0xf;
    uVar4 = *puVar16;
    uVar20 = (ulong)(uVar6 + uVar10);
    if ((s->helper_table == (GHashTable *)0x0) ||
       (pvVar8 = g_hash_table_lookup(s->helper_table,(gconstpointer)op->args[uVar20]),
       pvVar8 == (gpointer)0x0)) {
      TVar9 = 0;
    }
    else {
      TVar9 = *(TCGArg *)((long)pvVar8 + 8);
    }
    fprintf(pFVar5," %s %s,$0x%lx,$%d",uVar4,TVar9,op->args[uVar20 + 1],local_d0);
    for (uVar20 = 0; pFVar5 = _stderr, local_d0 != uVar20; uVar20 = uVar20 + 1) {
      tcg_get_arg_str(s,buf,(int)op->args[uVar20],TVar9);
      fprintf(pFVar5,",%s",buf);
    }
    for (uVar20 = 0; uVar10 != uVar20; uVar20 = uVar20 + 1) {
      pcVar14 = "<dummy>";
      if (op->args[local_d0 + uVar20] != 0) {
        tcg_get_arg_str(s,buf,(int)op->args[local_d0 + uVar20],TVar9);
        pcVar14 = buf;
      }
      fprintf(_stderr,",%s",pcVar14);
    }
    goto LAB_008efe45;
  }
  if (uVar6 == 0x81) {
    fwrite(" ----",5,1,_stderr);
    local_d0 = 0;
    for (lVar18 = 0; lVar18 != 2; lVar18 = lVar18 + 1) {
      fprintf(_stderr," %016lx",op->args[lVar18]);
    }
    goto LAB_008efe45;
  }
  fprintf(_stderr," %s ",*puVar16);
  bVar1 = *(byte *)(puVar16 + 1);
  local_d0 = (ulong)bVar1;
  bVar2 = *(byte *)((long)puVar16 + 9);
  uVar20 = (ulong)bVar2;
  bVar3 = *(byte *)((long)puVar16 + 10);
  if ((*(byte *)((long)puVar16 + 0xc) & 0x40) != 0) {
    in_RCX = (TCGArg)(uint)(8 << ((byte)(*(uint *)op >> 0xc) & 0xf));
    fprintf(_stderr,"v%d,e%d,",(ulong)(uint)(0x40 << ((byte)(*(uint *)op >> 8) & 0xf)));
  }
  uVar17 = (ulong)bVar1;
  for (uVar11 = 0; uVar17 != uVar11; uVar11 = uVar11 + 1) {
    if (uVar11 != 0) {
      fputc(0x2c,_stderr);
    }
    pFVar5 = _stderr;
    tcg_get_arg_str(s,buf,(int)op->args[uVar11],in_RCX);
    fputs(buf,pFVar5);
  }
  uVar12 = uVar20 + uVar11;
  for (; uVar12 != uVar17; uVar17 = uVar17 + 1) {
    if (uVar17 != 0) {
      fputc(0x2c,_stderr);
    }
    pFVar5 = _stderr;
    tcg_get_arg_str(s,buf,(int)op->args[uVar17],in_RCX);
    fputs(buf,pFVar5);
  }
  uVar19 = uVar10 & 0xff;
  uVar13 = 1;
  if ((uVar19 - 7 < 0x3c) && ((0xc0000c080000003U >> ((ulong)(uVar19 - 7) & 0x3f) & 1) != 0)) {
LAB_008efc2e:
    pcVar14 = (char *)op->args[uVar20 + uVar11];
    if (((uint)pcVar14 & 0xe) == 6 || (char *)0xd < pcVar14) {
      __format = ",$0x%lx";
    }
    else {
      pcVar14 = cond_name[(long)pcVar14];
      __format = ",%s";
    }
    fprintf(_stderr,__format,pcVar14);
    uVar12 = (ulong)((uint)bVar2 + (int)uVar11 + 1);
  }
  else if (uVar19 - 0x85 < 4) {
    uVar12 = uVar20 + uVar11 + 1;
    uVar7 = (uint)op->args[uVar20 + uVar11];
    uVar20 = op->args[uVar20 + uVar11] >> 4 & 0xfffffff;
    if (uVar7 < 0x800) {
      fprintf(_stderr,",%s%s,%u",
              alignment_name_rel + *(int *)(alignment_name_rel + (uVar7 >> 6 & 0x1c)),
              ldst_name[(uint)uVar20 & 0xf]);
    }
    else {
      fprintf(_stderr,",$0x%x,%u",uVar20,(ulong)(uVar7 & 0xf));
    }
  }
  else {
    if (((uVar19 == 0x67) || (uVar19 == 0xac)) || (uVar19 == 0xae)) goto LAB_008efc2e;
    uVar13 = 0;
  }
  if ((((byte)uVar10 < 0x2e) && ((0x20400000000aU >> ((ulong)uVar19 & 0x3f) & 1) != 0)) ||
     (uVar19 == 0x67)) {
    iVar15 = (int)uVar12;
    pcVar14 = ",";
    if (iVar15 == 0) {
      pcVar14 = "";
    }
    fprintf(_stderr,"%s$L%d",pcVar14,(ulong)(*(uint *)op->args[iVar15] >> 2 & 0x3fff));
    uVar13 = uVar13 + 1;
    uVar12 = (ulong)(iVar15 + 1);
  }
  uVar12 = uVar12 & 0xffffffff;
  for (; uVar13 < bVar3; uVar13 = uVar13 + 1) {
    pcVar14 = ",";
    if (uVar12 == 0) {
      pcVar14 = "";
    }
    fprintf(_stderr,"%s$0x%lx",pcVar14,op->args[uVar12]);
    uVar12 = uVar12 + 1;
  }
  if (((uVar6 == 0x3f) && (TVar9 = op->args[1], TVar9 != 0)) && (*(char *)(TVar9 + 1) == '\x02')) {
    fprintf(_stderr," mem_base=%p ",*(undefined8 *)(TVar9 + 0x10));
  }
LAB_008efe45:
  uVar10 = *(uint *)op;
  if (0xffff < uVar10) {
    if ((uVar10 & 0x30000) != 0) {
      fwrite("  sync:",7,1,_stderr);
      uVar20 = 0;
      while (uVar6 = (uint)uVar20, uVar6 != 2) {
        if (((uVar10 >> 0x10) >> (uVar6 & 0x1f) & 1) != 0) {
          fprintf(_stderr," %d",uVar20);
        }
        uVar20 = (ulong)(uVar6 + 1);
      }
    }
    if (0x3ffff < uVar10) {
      fwrite("  dead:",7,1,_stderr);
      uVar6 = 0;
      for (uVar10 = uVar10 >> 0x12; uVar10 != 0; uVar10 = uVar10 >> 1) {
        if ((uVar10 & 1) != 0) {
          fprintf(_stderr," %d",(ulong)uVar6);
        }
        uVar6 = uVar6 + 1;
      }
    }
  }
  if (have_prefs) {
    for (uVar20 = 0; local_d0 != uVar20; uVar20 = uVar20 + 1) {
      uVar10 = op->output_pref[uVar20];
      if (uVar20 == 0) {
        fwrite("  pref=",7,1,_stderr);
      }
      else {
        fputc(0x2c,_stderr);
      }
      if (uVar10 == 0xffffffff) {
        pcVar14 = "all";
        sStack_f0 = 3;
LAB_008efedf:
        fwrite(pcVar14,sStack_f0,1,_stderr);
      }
      else {
        if (uVar10 == 0) {
          pcVar14 = "none";
          sStack_f0 = 4;
          goto LAB_008efedf;
        }
        fprintf(_stderr,"%#x",(ulong)uVar10);
      }
    }
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void tcg_dump_op(TCGContext *s, bool have_prefs, TCGOp* op)
{
    char buf[128];
    int i, k, nb_oargs, nb_iargs, nb_cargs;
    const TCGOpDef *def;
    TCGOpcode c;

    c = op->opc;
    def = &s->tcg_op_defs[c];
    if (c == INDEX_op_insn_start) {
        nb_oargs = 0;
        fprintf(stderr, " ----");

        for (i = 0; i < TARGET_INSN_START_WORDS; ++i) {
            target_ulong a;
#if TARGET_LONG_BITS > TCG_TARGET_REG_BITS
            a = deposit64(op->args[i * 2], 32, 32, op->args[i * 2 + 1]);
#else
            a = op->args[i];
#endif
            fprintf(stderr, " " TARGET_FMT_lx, a);
        }
    } else if (c == INDEX_op_call) {
        /* variable number of arguments */
        nb_oargs = TCGOP_CALLO(op);
        nb_iargs = TCGOP_CALLI(op);
        nb_cargs = def->nb_cargs;

        /* function name, flags, out args */
        fprintf(stderr, " %s %s,$0x%" TCG_PRIlx ",$%d", def->name,
                      tcg_find_helper(s, op->args[nb_oargs + nb_iargs]),
                      op->args[nb_oargs + nb_iargs + 1], nb_oargs);
        for (i = 0; i < nb_oargs; i++) {
            fprintf(stderr, ",%s", tcg_get_arg_str(s, buf, sizeof(buf),
                                                 op->args[i]));
        }
        for (i = 0; i < nb_iargs; i++) {
            TCGArg arg = op->args[nb_oargs + i];
            const char *t = "<dummy>";
            if (arg != TCG_CALL_DUMMY_ARG) {
                t = tcg_get_arg_str(s, buf, sizeof(buf), arg);
            }
            fprintf(stderr, ",%s", t);
        }
    } else {
        fprintf(stderr, " %s ", def->name);

        nb_oargs = def->nb_oargs;
        nb_iargs = def->nb_iargs;
        nb_cargs = def->nb_cargs;

        if (def->flags & TCG_OPF_VECTOR) {
            fprintf(stderr, "v%d,e%d,", 64 << TCGOP_VECL(op),
                          8 << TCGOP_VECE(op));
        }

        k = 0;
        for (i = 0; i < nb_oargs; i++) {
            if (k != 0) {
                fprintf(stderr, ",");
            }
            fprintf(stderr, "%s", tcg_get_arg_str(s, buf, sizeof(buf),
                                                op->args[k++]));
        }
        for (i = 0; i < nb_iargs; i++) {
            if (k != 0) {
                fprintf(stderr, ",");
            }
            fprintf(stderr, "%s", tcg_get_arg_str(s, buf, sizeof(buf),
                                                op->args[k++]));
        }
        switch (c) {
            case INDEX_op_brcond_i32:
            case INDEX_op_setcond_i32:
            case INDEX_op_movcond_i32:
            case INDEX_op_brcond2_i32:
            case INDEX_op_setcond2_i32:
            case INDEX_op_brcond_i64:
            case INDEX_op_setcond_i64:
            case INDEX_op_movcond_i64:
            case INDEX_op_cmp_vec:
            case INDEX_op_cmpsel_vec:
                if (op->args[k] < ARRAY_SIZE(cond_name)
                    && cond_name[op->args[k]]) {
                    fprintf(stderr, ",%s", cond_name[op->args[k++]]);
                } else {
                    fprintf(stderr, ",$0x%" TCG_PRIlx, op->args[k++]);
                }
                i = 1;
                break;
            case INDEX_op_qemu_ld_i32:
            case INDEX_op_qemu_st_i32:
            case INDEX_op_qemu_ld_i64:
            case INDEX_op_qemu_st_i64:
            {
                TCGMemOpIdx oi = op->args[k++];
                MemOp op = get_memop(oi);
                unsigned ix = get_mmuidx(oi);

                if (op & ~(MO_AMASK | MO_BSWAP | MO_SSIZE)) {
                    fprintf(stderr, ",$0x%x,%u", op, ix);
                } else {
                    const char *s_al, *s_op;
                    s_al = alignment_name[(op & MO_AMASK) >> MO_ASHIFT];
                    s_op = ldst_name[op & (MO_BSWAP | MO_SSIZE)];
                    fprintf(stderr, ",%s%s,%u", s_al, s_op, ix);
                }
                i = 1;
            }
                break;
            default:
                i = 0;
                break;
        }
        switch (c) {
            case INDEX_op_set_label:
            case INDEX_op_br:
            case INDEX_op_brcond_i32:
            case INDEX_op_brcond_i64:
            case INDEX_op_brcond2_i32:
                fprintf(stderr, "%s$L%d", k ? "," : "",
                              arg_label(op->args[k])->id);
                i++, k++;
                break;
            default:
                break;
        }
        for (; i < nb_cargs; i++, k++) {
            fprintf(stderr, "%s$0x%" TCG_PRIlx, k ? "," : "", op->args[k]);
        }
        if(c == INDEX_op_mov_i64){
            struct TCGTemp* tp = arg_temp(op->args[1]);
            if (tp && tp->val_type == TEMP_VAL_MEM){
                fprintf(stderr, " mem_base=%p ", tp->mem_base);
            }
        }
    }

    if (op->life) {
        unsigned life = op->life;

        if (life & (SYNC_ARG * 3)) {
            fprintf(stderr, "  sync:");
            for (i = 0; i < 2; ++i) {
                if (life & (SYNC_ARG << i)) {
                    fprintf(stderr, " %d", i);
                }
            }
        }
        life /= DEAD_ARG;
        if (life) {
            fprintf(stderr, "  dead:");
            for (i = 0; life; ++i, life >>= 1) {
                if (life & 1) {
                    fprintf(stderr, " %d", i);
                }
            }
        }
    }

    if (have_prefs) {
        for (i = 0; i < nb_oargs; ++i) {
            TCGRegSet set = op->output_pref[i];

            if (i == 0) {
                fprintf(stderr, "  pref=");
            } else {
                fprintf(stderr, ",");
            }
            if (set == 0) {
                fprintf(stderr, "none");
            } else if (set == MAKE_64BIT_MASK(0, TCG_TARGET_NB_REGS)) {
                fprintf(stderr, "all");
#ifdef CONFIG_DEBUG_TCG
                } else if (tcg_regset_single(set)) {
                    TCGReg reg = tcg_regset_first(set);
                    fprintf(stderr, "%s", tcg_target_reg_names[reg]);
#endif
            } else if (TCG_TARGET_NB_REGS <= 32) {
                fprintf(stderr, "%#x", (uint32_t)set);
            } else {
                fprintf(stderr, "%#" PRIx64, (uint64_t)set);
            }
        }
    }

    fprintf(stderr, "\n");
}